

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

size_t mbedtls_mpi_core_exp_mod_working_limbs(size_t AN_limbs,size_t E_limbs)

{
  size_t sVar1;
  size_t temp_limbs;
  size_t select_limbs;
  size_t table_limbs;
  size_t welem;
  size_t wsize;
  size_t E_limbs_local;
  size_t AN_limbs_local;
  
  sVar1 = exp_mod_get_window_size(E_limbs << 6);
  return (1L << ((byte)sVar1 & 0x3f)) * AN_limbs + AN_limbs * 3 + 1;
}

Assistant:

size_t mbedtls_mpi_core_exp_mod_working_limbs(size_t AN_limbs, size_t E_limbs)
{
    const size_t wsize = exp_mod_get_window_size(E_limbs * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* How big does each part of the working memory pool need to be? */
    const size_t table_limbs   = welem * AN_limbs;
    const size_t select_limbs  = AN_limbs;
    const size_t temp_limbs    = 2 * AN_limbs + 1;

    return table_limbs + select_limbs + temp_limbs;
}